

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void __thiscall embree::SceneGraph::HairSetNode::compact_vertices(HairSetNode *this)

{
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *in;
  float *pfVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  undefined8 uVar7;
  ulong uVar8;
  bool bVar9;
  Vec3fx *pVVar10;
  Vec3fx *pVVar11;
  pointer pvVar12;
  ulong uVar13;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *v;
  long lVar14;
  pointer pHVar15;
  ulong uVar16;
  pointer pvVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  local_b8;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined8 local_88;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  float fStack_70;
  float fStack_6c;
  long local_60;
  long local_58;
  ulong local_50;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  local_48;
  
  std::
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ::vector(&local_b8,
           (long)(this->positions).
                 super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->positions).
                 super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_48);
  pvVar12 = (this->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->positions).
      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar12) {
    lVar14 = 8;
    uVar20 = 0;
    do {
      std::
      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ::reserve(&local_b8,*(size_type *)(&pvVar12->field_0x0 + lVar14));
      uVar20 = uVar20 + 1;
      pvVar12 = (this->positions).
                super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar14 = lVar14 + 0x20;
    } while (uVar20 < (ulong)((long)(this->positions).
                                    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar12 >> 5)
            );
  }
  pHVar15 = (this->hairs).
            super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar17 = local_b8.
            super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar12 = local_b8.
            super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->hairs).
      super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
      ._M_impl.super__Vector_impl_data._M_finish != pHVar15) {
    in = &this->positions;
    uVar20 = 0;
    do {
      uVar4 = pHVar15[uVar20].vertex;
      uVar13 = (ulong)uVar4;
      sVar5 = (local_b8.
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->size_active;
      bVar9 = test_location(in,uVar13,&local_b8,sVar5 - 1);
      uVar19 = (uint)sVar5;
      local_50 = uVar20;
      if (bVar9) {
        pHVar15[uVar20].vertex = uVar19 - 1;
        pvVar12 = (this->positions).
                  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((this->positions).
            super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != pvVar12) {
          local_58 = (ulong)(uVar4 + 1) << 4;
          local_60 = (ulong)(uVar4 + 2) << 4;
          local_78 = (ulong)(uVar4 + 3) << 4;
          uVar20 = 0;
          do {
            pvVar17 = local_b8.
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            sVar5 = local_b8.
                    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar20].size_active;
            uVar6 = local_b8.
                    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar20].size_alloced;
            uVar13 = sVar5 + 1;
            uVar16 = uVar6;
            if ((uVar6 < uVar13) && (uVar16 = uVar13, uVar8 = uVar6, uVar6 != 0)) {
              for (; uVar16 = uVar8, uVar8 < uVar13; uVar8 = uVar8 * 2 + (ulong)(uVar8 * 2 == 0)) {
              }
            }
            pfVar1 = (float *)((long)&(pvVar12[uVar20].items)->field_0 + local_58);
            fVar21 = *pfVar1;
            fVar22 = pfVar1[1];
            fVar23 = pfVar1[2];
            fVar24 = pfVar1[3];
            if (uVar6 != uVar16) {
              pVVar11 = local_b8.
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar20].items;
              local_88 = *(long *)pfVar1;
              fStack_80 = pfVar1[2];
              fStack_7c = pfVar1[3];
              pVVar10 = (Vec3fx *)alignedMalloc(uVar16 << 4,0x10);
              pvVar17[uVar20].items = pVVar10;
              if (pvVar17[uVar20].size_active != 0) {
                lVar14 = 0;
                uVar13 = 0;
                do {
                  puVar3 = (undefined8 *)((long)&pVVar11->field_0 + lVar14);
                  uVar7 = puVar3[1];
                  puVar2 = (undefined8 *)((long)&(pvVar17[uVar20].items)->field_0 + lVar14);
                  *puVar2 = *puVar3;
                  puVar2[1] = uVar7;
                  uVar13 = uVar13 + 1;
                  lVar14 = lVar14 + 0x10;
                } while (uVar13 < pvVar17[uVar20].size_active);
              }
              alignedFree(pVVar11);
              pvVar17[uVar20].size_active = sVar5;
              pvVar17[uVar20].size_alloced = uVar16;
              fVar21 = (float)local_88;
              fVar22 = local_88._4_4_;
              fVar23 = fStack_80;
              fVar24 = fStack_7c;
            }
            pvVar12 = local_b8.
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            sVar5 = pvVar17[uVar20].size_active;
            pvVar17[uVar20].size_active = sVar5 + 1;
            pVVar11 = pvVar17[uVar20].items + sVar5;
            (pVVar11->field_0).m128[0] = fVar21;
            (pVVar11->field_0).m128[1] = fVar22;
            (pVVar11->field_0).m128[2] = fVar23;
            (pVVar11->field_0).m128[3] = fVar24;
            pfVar1 = (float *)((long)&((in->
                                       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar20].items)->
                                      field_0 + local_60);
            sVar5 = local_b8.
                    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar20].size_active;
            uVar6 = local_b8.
                    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar20].size_alloced;
            uVar13 = sVar5 + 1;
            uVar16 = uVar6;
            if ((uVar6 < uVar13) && (uVar16 = uVar13, uVar8 = uVar6, uVar6 != 0)) {
              for (; uVar16 = uVar8, uVar8 < uVar13; uVar8 = uVar8 * 2 + (ulong)(uVar8 * 2 == 0)) {
              }
            }
            fVar21 = *pfVar1;
            fVar22 = pfVar1[1];
            fVar23 = pfVar1[2];
            fVar24 = pfVar1[3];
            if (uVar6 != uVar16) {
              pVVar11 = local_b8.
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar20].items;
              local_88 = *(long *)pfVar1;
              fStack_80 = pfVar1[2];
              fStack_7c = pfVar1[3];
              pVVar10 = (Vec3fx *)alignedMalloc(uVar16 << 4,0x10);
              pvVar12[uVar20].items = pVVar10;
              if (pvVar12[uVar20].size_active != 0) {
                lVar14 = 0;
                uVar13 = 0;
                do {
                  puVar3 = (undefined8 *)((long)&pVVar11->field_0 + lVar14);
                  uVar7 = puVar3[1];
                  puVar2 = (undefined8 *)((long)&(pvVar12[uVar20].items)->field_0 + lVar14);
                  *puVar2 = *puVar3;
                  puVar2[1] = uVar7;
                  uVar13 = uVar13 + 1;
                  lVar14 = lVar14 + 0x10;
                } while (uVar13 < pvVar12[uVar20].size_active);
              }
              alignedFree(pVVar11);
              pvVar12[uVar20].size_active = sVar5;
              pvVar12[uVar20].size_alloced = uVar16;
              fVar21 = (float)local_88;
              fVar22 = local_88._4_4_;
              fVar23 = fStack_80;
              fVar24 = fStack_7c;
            }
            pvVar17 = local_b8.
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            sVar5 = pvVar12[uVar20].size_active;
            pvVar12[uVar20].size_active = sVar5 + 1;
            pVVar11 = pvVar12[uVar20].items + sVar5;
            (pVVar11->field_0).m128[0] = fVar21;
            (pVVar11->field_0).m128[1] = fVar22;
            (pVVar11->field_0).m128[2] = fVar23;
            (pVVar11->field_0).m128[3] = fVar24;
            pfVar1 = (float *)((long)&((in->
                                       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar20].items)->
                                      field_0 + local_78);
            sVar5 = local_b8.
                    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar20].size_active;
            uVar6 = local_b8.
                    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar20].size_alloced;
            uVar13 = sVar5 + 1;
            uVar16 = uVar6;
            if ((uVar6 < uVar13) && (uVar16 = uVar13, uVar8 = uVar6, uVar6 != 0)) {
              for (; uVar16 = uVar8, uVar8 < uVar13; uVar8 = uVar8 * 2 + (ulong)(uVar8 * 2 == 0)) {
              }
            }
            fVar21 = *pfVar1;
            fVar22 = pfVar1[1];
            fVar23 = pfVar1[2];
            fVar24 = pfVar1[3];
            if (uVar6 != uVar16) {
              pVVar11 = local_b8.
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar20].items;
              local_88 = *(long *)pfVar1;
              fStack_80 = pfVar1[2];
              fStack_7c = pfVar1[3];
              pVVar10 = (Vec3fx *)alignedMalloc(uVar16 << 4,0x10);
              pvVar17[uVar20].items = pVVar10;
              if (pvVar17[uVar20].size_active != 0) {
                lVar14 = 0;
                uVar13 = 0;
                do {
                  puVar3 = (undefined8 *)((long)&pVVar11->field_0 + lVar14);
                  uVar7 = puVar3[1];
                  puVar2 = (undefined8 *)((long)&(pvVar17[uVar20].items)->field_0 + lVar14);
                  *puVar2 = *puVar3;
                  puVar2[1] = uVar7;
                  uVar13 = uVar13 + 1;
                  lVar14 = lVar14 + 0x10;
                } while (uVar13 < pvVar17[uVar20].size_active);
              }
              alignedFree(pVVar11);
              pvVar17[uVar20].size_active = sVar5;
              pvVar17[uVar20].size_alloced = uVar16;
              fVar21 = (float)local_88;
              fVar22 = local_88._4_4_;
              fVar23 = fStack_80;
              fVar24 = fStack_7c;
            }
            sVar5 = pvVar17[uVar20].size_active;
            pvVar17[uVar20].size_active = sVar5 + 1;
            pVVar11 = pvVar17[uVar20].items + sVar5;
            (pVVar11->field_0).m128[0] = fVar21;
            (pVVar11->field_0).m128[1] = fVar22;
            (pVVar11->field_0).m128[2] = fVar23;
            (pVVar11->field_0).m128[3] = fVar24;
            uVar20 = uVar20 + 1;
            pvVar12 = (this->positions).
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar20 < (ulong)((long)(this->positions).
                                          super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar12
                                   >> 5));
        }
      }
      else {
        local_78 = uVar13;
        bVar9 = test_location(in,uVar13,&local_b8,sVar5 - 3);
        iVar18 = (int)local_78;
        if (bVar9) {
          pHVar15[uVar20].vertex = uVar19 - 3;
          pvVar12 = (this->positions).
                    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((this->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != pvVar12) {
            uVar20 = 0;
            do {
              pvVar17 = local_b8.
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              sVar5 = local_b8.
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar20].size_active;
              uVar6 = local_b8.
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar20].size_alloced;
              uVar13 = sVar5 + 1;
              uVar16 = uVar6;
              if ((uVar6 < uVar13) && (uVar16 = uVar13, uVar8 = uVar6, uVar6 != 0)) {
                for (; uVar16 = uVar8, uVar8 < uVar13; uVar8 = uVar8 * 2 + (ulong)(uVar8 * 2 == 0))
                {
                }
              }
              pVVar11 = pvVar12[uVar20].items + (iVar18 + 3);
              fVar21 = (pVVar11->field_0).m128[0];
              fVar22 = (pVVar11->field_0).m128[1];
              fVar23 = (pVVar11->field_0).m128[2];
              fVar24 = (pVVar11->field_0).m128[3];
              if (uVar6 != uVar16) {
                pVVar10 = local_b8.
                          super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar20].items;
                local_78 = *(ulong *)&pVVar11->field_0;
                fStack_70 = (pVVar11->field_0).m128[2];
                fStack_6c = (pVVar11->field_0).m128[3];
                pVVar11 = (Vec3fx *)alignedMalloc(uVar16 << 4,0x10);
                pvVar17[uVar20].items = pVVar11;
                if (pvVar17[uVar20].size_active != 0) {
                  lVar14 = 0;
                  uVar13 = 0;
                  do {
                    puVar3 = (undefined8 *)((long)&pVVar10->field_0 + lVar14);
                    uVar7 = puVar3[1];
                    puVar2 = (undefined8 *)((long)&(pvVar17[uVar20].items)->field_0 + lVar14);
                    *puVar2 = *puVar3;
                    puVar2[1] = uVar7;
                    uVar13 = uVar13 + 1;
                    lVar14 = lVar14 + 0x10;
                  } while (uVar13 < pvVar17[uVar20].size_active);
                }
                alignedFree(pVVar10);
                pvVar17[uVar20].size_active = sVar5;
                pvVar17[uVar20].size_alloced = uVar16;
                fVar21 = (float)local_78;
                fVar22 = local_78._4_4_;
                fVar23 = fStack_70;
                fVar24 = fStack_6c;
              }
              sVar5 = pvVar17[uVar20].size_active;
              pvVar17[uVar20].size_active = sVar5 + 1;
              pVVar11 = pvVar17[uVar20].items + sVar5;
              (pVVar11->field_0).m128[0] = fVar21;
              (pVVar11->field_0).m128[1] = fVar22;
              (pVVar11->field_0).m128[2] = fVar23;
              (pVVar11->field_0).m128[3] = fVar24;
              uVar20 = uVar20 + 1;
              pvVar12 = (this->positions).
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar20 < (ulong)((long)(this->positions).
                                            super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pvVar12 >> 5));
          }
        }
        else {
          pHVar15[uVar20].vertex = uVar19;
          pvVar12 = (this->positions).
                    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((this->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != pvVar12) {
            local_58 = (ulong)(iVar18 + 1) << 4;
            local_60 = (ulong)(iVar18 + 2) << 4;
            local_88 = (ulong)(iVar18 + 3) << 4;
            uVar20 = 0;
            do {
              pvVar17 = local_b8.
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              sVar5 = local_b8.
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar20].size_active;
              uVar6 = local_b8.
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar20].size_alloced;
              uVar13 = sVar5 + 1;
              uVar16 = uVar6;
              if ((uVar6 < uVar13) && (uVar16 = uVar13, uVar8 = uVar6, uVar6 != 0)) {
                for (; uVar16 = uVar8, uVar8 < uVar13; uVar8 = uVar8 * 2 + (ulong)(uVar8 * 2 == 0))
                {
                }
              }
              pVVar11 = pvVar12[uVar20].items + local_78;
              fVar21 = (pVVar11->field_0).m128[0];
              fVar22 = (pVVar11->field_0).m128[1];
              fVar23 = (pVVar11->field_0).m128[2];
              fVar24 = (pVVar11->field_0).m128[3];
              if (uVar6 != uVar16) {
                pVVar10 = local_b8.
                          super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar20].items;
                local_98 = (pVVar11->field_0).m128[0];
                fStack_94 = (pVVar11->field_0).m128[1];
                fStack_90 = (pVVar11->field_0).m128[2];
                fStack_8c = (pVVar11->field_0).m128[3];
                pVVar11 = (Vec3fx *)alignedMalloc(uVar16 << 4,0x10);
                pvVar17[uVar20].items = pVVar11;
                if (pvVar17[uVar20].size_active != 0) {
                  lVar14 = 0;
                  uVar13 = 0;
                  do {
                    puVar3 = (undefined8 *)((long)&pVVar10->field_0 + lVar14);
                    uVar7 = puVar3[1];
                    puVar2 = (undefined8 *)((long)&(pvVar17[uVar20].items)->field_0 + lVar14);
                    *puVar2 = *puVar3;
                    puVar2[1] = uVar7;
                    uVar13 = uVar13 + 1;
                    lVar14 = lVar14 + 0x10;
                  } while (uVar13 < pvVar17[uVar20].size_active);
                }
                alignedFree(pVVar10);
                pvVar17[uVar20].size_active = sVar5;
                pvVar17[uVar20].size_alloced = uVar16;
                fVar21 = local_98;
                fVar22 = fStack_94;
                fVar23 = fStack_90;
                fVar24 = fStack_8c;
              }
              pvVar12 = local_b8.
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              sVar5 = pvVar17[uVar20].size_active;
              pvVar17[uVar20].size_active = sVar5 + 1;
              pVVar11 = pvVar17[uVar20].items + sVar5;
              (pVVar11->field_0).m128[0] = fVar21;
              (pVVar11->field_0).m128[1] = fVar22;
              (pVVar11->field_0).m128[2] = fVar23;
              (pVVar11->field_0).m128[3] = fVar24;
              pfVar1 = (float *)((long)&((in->
                                         super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar20].items)->
                                        field_0 + local_58);
              sVar5 = local_b8.
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar20].size_active;
              uVar6 = local_b8.
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar20].size_alloced;
              uVar13 = sVar5 + 1;
              uVar16 = uVar6;
              if ((uVar6 < uVar13) && (uVar16 = uVar13, uVar8 = uVar6, uVar6 != 0)) {
                for (; uVar16 = uVar8, uVar8 < uVar13; uVar8 = uVar8 * 2 + (ulong)(uVar8 * 2 == 0))
                {
                }
              }
              fVar21 = *pfVar1;
              fVar22 = pfVar1[1];
              fVar23 = pfVar1[2];
              fVar24 = pfVar1[3];
              if (uVar6 != uVar16) {
                pVVar11 = local_b8.
                          super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar20].items;
                local_98 = *pfVar1;
                fStack_94 = pfVar1[1];
                fStack_90 = pfVar1[2];
                fStack_8c = pfVar1[3];
                pVVar10 = (Vec3fx *)alignedMalloc(uVar16 << 4,0x10);
                pvVar12[uVar20].items = pVVar10;
                if (pvVar12[uVar20].size_active != 0) {
                  lVar14 = 0;
                  uVar13 = 0;
                  do {
                    puVar3 = (undefined8 *)((long)&pVVar11->field_0 + lVar14);
                    uVar7 = puVar3[1];
                    puVar2 = (undefined8 *)((long)&(pvVar12[uVar20].items)->field_0 + lVar14);
                    *puVar2 = *puVar3;
                    puVar2[1] = uVar7;
                    uVar13 = uVar13 + 1;
                    lVar14 = lVar14 + 0x10;
                  } while (uVar13 < pvVar12[uVar20].size_active);
                }
                alignedFree(pVVar11);
                pvVar12[uVar20].size_active = sVar5;
                pvVar12[uVar20].size_alloced = uVar16;
                fVar21 = local_98;
                fVar22 = fStack_94;
                fVar23 = fStack_90;
                fVar24 = fStack_8c;
              }
              pvVar17 = local_b8.
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              sVar5 = pvVar12[uVar20].size_active;
              pvVar12[uVar20].size_active = sVar5 + 1;
              pVVar11 = pvVar12[uVar20].items + sVar5;
              (pVVar11->field_0).m128[0] = fVar21;
              (pVVar11->field_0).m128[1] = fVar22;
              (pVVar11->field_0).m128[2] = fVar23;
              (pVVar11->field_0).m128[3] = fVar24;
              pfVar1 = (float *)((long)&((in->
                                         super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar20].items)->
                                        field_0 + local_60);
              sVar5 = local_b8.
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar20].size_active;
              uVar6 = local_b8.
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar20].size_alloced;
              uVar13 = sVar5 + 1;
              uVar16 = uVar6;
              if ((uVar6 < uVar13) && (uVar16 = uVar13, uVar8 = uVar6, uVar6 != 0)) {
                for (; uVar16 = uVar8, uVar8 < uVar13; uVar8 = uVar8 * 2 + (ulong)(uVar8 * 2 == 0))
                {
                }
              }
              fVar21 = *pfVar1;
              fVar22 = pfVar1[1];
              fVar23 = pfVar1[2];
              fVar24 = pfVar1[3];
              if (uVar6 != uVar16) {
                pVVar11 = local_b8.
                          super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar20].items;
                local_98 = *pfVar1;
                fStack_94 = pfVar1[1];
                fStack_90 = pfVar1[2];
                fStack_8c = pfVar1[3];
                pVVar10 = (Vec3fx *)alignedMalloc(uVar16 << 4,0x10);
                pvVar17[uVar20].items = pVVar10;
                if (pvVar17[uVar20].size_active != 0) {
                  lVar14 = 0;
                  uVar13 = 0;
                  do {
                    puVar3 = (undefined8 *)((long)&pVVar11->field_0 + lVar14);
                    uVar7 = puVar3[1];
                    puVar2 = (undefined8 *)((long)&(pvVar17[uVar20].items)->field_0 + lVar14);
                    *puVar2 = *puVar3;
                    puVar2[1] = uVar7;
                    uVar13 = uVar13 + 1;
                    lVar14 = lVar14 + 0x10;
                  } while (uVar13 < pvVar17[uVar20].size_active);
                }
                alignedFree(pVVar11);
                pvVar17[uVar20].size_active = sVar5;
                pvVar17[uVar20].size_alloced = uVar16;
                fVar21 = local_98;
                fVar22 = fStack_94;
                fVar23 = fStack_90;
                fVar24 = fStack_8c;
              }
              pvVar12 = local_b8.
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              sVar5 = pvVar17[uVar20].size_active;
              pvVar17[uVar20].size_active = sVar5 + 1;
              pVVar11 = pvVar17[uVar20].items + sVar5;
              (pVVar11->field_0).m128[0] = fVar21;
              (pVVar11->field_0).m128[1] = fVar22;
              (pVVar11->field_0).m128[2] = fVar23;
              (pVVar11->field_0).m128[3] = fVar24;
              pfVar1 = (float *)((long)&((in->
                                         super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar20].items)->
                                        field_0 + local_88);
              sVar5 = local_b8.
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar20].size_active;
              uVar6 = local_b8.
                      super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar20].size_alloced;
              uVar13 = sVar5 + 1;
              uVar16 = uVar6;
              if ((uVar6 < uVar13) && (uVar16 = uVar13, uVar8 = uVar6, uVar6 != 0)) {
                for (; uVar16 = uVar8, uVar8 < uVar13; uVar8 = uVar8 * 2 + (ulong)(uVar8 * 2 == 0))
                {
                }
              }
              fVar21 = *pfVar1;
              fVar22 = pfVar1[1];
              fVar23 = pfVar1[2];
              fVar24 = pfVar1[3];
              if (uVar6 != uVar16) {
                pVVar11 = local_b8.
                          super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar20].items;
                local_98 = *pfVar1;
                fStack_94 = pfVar1[1];
                fStack_90 = pfVar1[2];
                fStack_8c = pfVar1[3];
                pVVar10 = (Vec3fx *)alignedMalloc(uVar16 << 4,0x10);
                pvVar12[uVar20].items = pVVar10;
                if (pvVar12[uVar20].size_active != 0) {
                  lVar14 = 0;
                  uVar13 = 0;
                  do {
                    puVar3 = (undefined8 *)((long)&pVVar11->field_0 + lVar14);
                    uVar7 = puVar3[1];
                    puVar2 = (undefined8 *)((long)&(pvVar12[uVar20].items)->field_0 + lVar14);
                    *puVar2 = *puVar3;
                    puVar2[1] = uVar7;
                    uVar13 = uVar13 + 1;
                    lVar14 = lVar14 + 0x10;
                  } while (uVar13 < pvVar12[uVar20].size_active);
                }
                alignedFree(pVVar11);
                pvVar12[uVar20].size_active = sVar5;
                pvVar12[uVar20].size_alloced = uVar16;
                fVar21 = local_98;
                fVar22 = fStack_94;
                fVar23 = fStack_90;
                fVar24 = fStack_8c;
              }
              sVar5 = pvVar12[uVar20].size_active;
              pvVar12[uVar20].size_active = sVar5 + 1;
              pVVar11 = pvVar12[uVar20].items + sVar5;
              (pVVar11->field_0).m128[0] = fVar21;
              (pVVar11->field_0).m128[1] = fVar22;
              (pVVar11->field_0).m128[2] = fVar23;
              (pVVar11->field_0).m128[3] = fVar24;
              uVar20 = uVar20 + 1;
              pvVar12 = (this->positions).
                        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar20 < (ulong)((long)(this->positions).
                                            super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pvVar12 >> 5));
          }
        }
      }
      uVar20 = local_50 + 1;
      pHVar15 = (this->hairs).
                super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar17 = local_b8.
                super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar12 = local_b8.
                super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar20 < (ulong)((long)(this->hairs).
                                    super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar15 >> 3)
            );
  }
  for (; pvVar17 != pvVar12; pvVar17 = pvVar17 + 1) {
    sVar5 = pvVar17->size_active;
    if (pvVar17->size_alloced != sVar5) {
      pVVar11 = pvVar17->items;
      pVVar10 = (Vec3fx *)alignedMalloc(sVar5 << 4,0x10);
      pvVar17->items = pVVar10;
      if (pvVar17->size_active != 0) {
        lVar14 = 0;
        uVar20 = 0;
        do {
          puVar2 = (undefined8 *)((long)&pVVar11->field_0 + lVar14);
          uVar7 = puVar2[1];
          puVar3 = (undefined8 *)((long)&pvVar17->items->field_0 + lVar14);
          *puVar3 = *puVar2;
          puVar3[1] = uVar7;
          uVar20 = uVar20 + 1;
          lVar14 = lVar14 + 0x10;
        } while (uVar20 < pvVar17->size_active);
      }
      alignedFree(pVVar11);
      pvVar17->size_active = sVar5;
      pvVar17->size_alloced = sVar5;
    }
  }
  local_48.
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->positions).
       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->positions).
       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->positions).
       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->positions).
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_b8.
       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->positions).
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_b8.
       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->positions).
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_b8.
       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8.
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ::~vector(&local_48);
  std::
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ::~vector(&local_b8);
  return;
}

Assistant:

void SceneGraph::HairSetNode::compact_vertices()
  {
    std::vector<avector<Vec3ff>> positions_o(positions.size());
    for (size_t i=0; i<positions.size(); i++)
      positions_o.reserve(positions[i].size());
    
    for (size_t i=0; i<hairs.size(); i++) 
    {
      unsigned idx = hairs[i].vertex;
      if (test_location(positions,idx,positions_o,positions_o[0].size()-1)) 
      {
        hairs[i].vertex = (unsigned) positions_o[0].size()-1;
        for (size_t k=0; k<positions.size(); k++) {
          positions_o[k].push_back(positions[k][idx+1]);
          positions_o[k].push_back(positions[k][idx+2]);
          positions_o[k].push_back(positions[k][idx+3]);
        }
      }

      else if (test_location(positions,idx,positions_o,positions_o[0].size()-3)) 
      {
        hairs[i].vertex = (unsigned) positions_o[0].size()-3;
        for (size_t k=0; k<positions.size(); k++)
          positions_o[k].push_back(positions[k][idx+3]);
      }

      else
      {
        hairs[i].vertex = (unsigned) positions_o[0].size();
        for (size_t k=0; k<positions.size(); k++) {
          positions_o[k].push_back(positions[k][idx+0]);
          positions_o[k].push_back(positions[k][idx+1]);
          positions_o[k].push_back(positions[k][idx+2]);
          positions_o[k].push_back(positions[k][idx+3]);
        }
      }
    }

    for (auto& v : positions_o)
      v.shrink_to_fit();
   
    positions = std::move(positions_o);
  }